

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

VkImageAspectFlags vkt::api::anon_unknown_0::getAspectFlags(TextureFormat format)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  
  bVar2 = tcu::hasDepthComponent(format.order);
  bVar3 = tcu::hasStencilComponent(format.order);
  iVar1 = (uint)bVar2 * 2 + (uint)bVar3 * 4;
  return iVar1 + (uint)(iVar1 == 0);
}

Assistant:

VkImageAspectFlags getAspectFlags (tcu::TextureFormat format)
{
	VkImageAspectFlags	aspectFlag	= 0;
	aspectFlag |= (tcu::hasDepthComponent(format.order)? VK_IMAGE_ASPECT_DEPTH_BIT : 0);
	aspectFlag |= (tcu::hasStencilComponent(format.order)? VK_IMAGE_ASPECT_STENCIL_BIT : 0);

	if (!aspectFlag)
		aspectFlag = VK_IMAGE_ASPECT_COLOR_BIT;

	return aspectFlag;
}